

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::reorderPatternsByPartition
          (BeagleCPUImpl<float,_1,_0> *this)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  double *pdVar5;
  int *piVar6;
  int **ppiVar7;
  float *pfVar8;
  float **ppfVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  int *piVar17;
  void *__ptr;
  double *pdVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  float *pfVar27;
  int iVar28;
  float *pfVar29;
  ulong uVar30;
  int iVar31;
  float *__ptr_00;
  ushort uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  void *ptr;
  float *local_38;
  
  iVar24 = -7;
  if (this->kPatternsReordered == false) {
    uVar26 = (ulong)this->kPatternCount;
    piVar17 = (int *)malloc(uVar26 * 4);
    this->gPatternsNewOrder = piVar17;
    uVar30 = (ulong)this->kPartitionCount;
    __ptr = malloc(uVar30 * 4);
    pdVar18 = (double *)malloc(uVar26 * 8);
    if (0 < (long)uVar30) {
      piVar4 = this->gPatternPartitionsStartPatterns;
      lVar21 = 0;
      do {
        piVar4[lVar21] = 0;
        *(undefined4 *)((long)__ptr + lVar21 * 4) = 0;
        lVar21 = lVar21 + 1;
        uVar30 = (ulong)this->kPartitionCount;
      } while (lVar21 < (long)uVar30);
      uVar26 = (ulong)(uint)this->kPatternCount;
    }
    iVar24 = (int)uVar26;
    if (0 < iVar24) {
      piVar4 = this->gPatternPartitions;
      uVar22 = 0;
      do {
        iVar19 = piVar4[uVar22];
        iVar25 = *(int *)((long)__ptr + (long)iVar19 * 4);
        piVar17[uVar22] = iVar25;
        uVar22 = uVar22 + 1;
        *(int *)((long)__ptr + (long)iVar19 * 4) = iVar25 + 1;
      } while ((uVar26 & 0xffffffff) != uVar22);
    }
    piVar4 = this->gPatternPartitionsStartPatterns;
    if ((int)uVar30 < 1) {
      lVar21 = (long)(int)uVar30;
    }
    else {
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar26 = 0xf;
      lVar23 = 0;
      do {
        if (lVar23 != 0) {
          auVar39 = ZEXT464((uint)piVar4[lVar23]);
          auVar36 = vpbroadcastq_avx512f();
          uVar30 = 0;
          do {
            auVar37 = vpbroadcastq_avx512f();
            auVar38 = vmovdqa64_avx512f(auVar39);
            auVar39 = vporq_avx512f(auVar37,auVar34);
            auVar37 = vporq_avx512f(auVar37,auVar35);
            uVar13 = vpcmpuq_avx512f(auVar37,auVar36,2);
            bVar14 = (byte)uVar13;
            uVar13 = vpcmpuq_avx512f(auVar39,auVar36,2);
            bVar15 = (byte)uVar13;
            uVar32 = CONCAT11(bVar15,bVar14);
            auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)__ptr + uVar30 * 4));
            auVar37._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar39._4_4_;
            auVar37._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
            auVar37._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar39._8_4_;
            auVar37._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar39._12_4_;
            auVar37._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar39._16_4_;
            auVar37._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar39._20_4_;
            auVar37._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar39._24_4_;
            auVar37._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar39._28_4_;
            auVar37._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
            auVar37._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
            auVar37._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
            auVar37._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
            auVar37._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
            auVar37._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
            auVar37._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
            auVar37._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
            uVar30 = uVar30 + 0x10;
            auVar39 = vpaddd_avx512f(auVar38,auVar37);
          } while ((uVar26 & 0xfffffffffffffff0) != uVar30);
          auVar36 = vmovdqa32_avx512f(auVar39);
          auVar39._0_4_ =
               (uint)(bVar14 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar38._0_4_;
          bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar39._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * auVar38._4_4_;
          bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar39._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * auVar38._8_4_;
          bVar10 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar39._12_4_ = (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar38._12_4_;
          bVar10 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar39._16_4_ = (uint)bVar10 * auVar36._16_4_ | (uint)!bVar10 * auVar38._16_4_;
          bVar10 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar39._20_4_ = (uint)bVar10 * auVar36._20_4_ | (uint)!bVar10 * auVar38._20_4_;
          bVar10 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar39._24_4_ = (uint)bVar10 * auVar36._24_4_ | (uint)!bVar10 * auVar38._24_4_;
          bVar10 = (bool)((byte)(uVar32 >> 7) & 1);
          auVar39._28_4_ = (uint)bVar10 * auVar36._28_4_ | (uint)!bVar10 * auVar38._28_4_;
          auVar39._32_4_ =
               (uint)(bVar15 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar38._32_4_;
          bVar10 = (bool)(bVar15 >> 1 & 1);
          auVar39._36_4_ = (uint)bVar10 * auVar36._36_4_ | (uint)!bVar10 * auVar38._36_4_;
          bVar10 = (bool)(bVar15 >> 2 & 1);
          auVar39._40_4_ = (uint)bVar10 * auVar36._40_4_ | (uint)!bVar10 * auVar38._40_4_;
          bVar10 = (bool)(bVar15 >> 3 & 1);
          auVar39._44_4_ = (uint)bVar10 * auVar36._44_4_ | (uint)!bVar10 * auVar38._44_4_;
          bVar10 = (bool)(bVar15 >> 4 & 1);
          auVar39._48_4_ = (uint)bVar10 * auVar36._48_4_ | (uint)!bVar10 * auVar38._48_4_;
          bVar10 = (bool)(bVar15 >> 5 & 1);
          auVar39._52_4_ = (uint)bVar10 * auVar36._52_4_ | (uint)!bVar10 * auVar38._52_4_;
          bVar10 = (bool)(bVar15 >> 6 & 1);
          auVar39._56_4_ = (uint)bVar10 * auVar36._56_4_ | (uint)!bVar10 * auVar38._56_4_;
          auVar39._60_4_ =
               (uint)(bVar15 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar38._60_4_;
          auVar33 = vextracti64x4_avx512f(auVar39,1);
          auVar36 = vpaddd_avx512f(auVar39,ZEXT3264(auVar33));
          auVar11 = vpaddd_avx(auVar36._0_16_,auVar36._16_16_);
          auVar12 = vpshufd_avx(auVar11,0xee);
          auVar11 = vpaddd_avx(auVar11,auVar12);
          auVar12 = vpshufd_avx(auVar11,0x55);
          auVar11 = vpaddd_avx(auVar11,auVar12);
          piVar4[lVar23] = auVar11._0_4_;
          uVar30 = (ulong)(uint)this->kPartitionCount;
        }
        lVar23 = lVar23 + 1;
        lVar21 = (long)(int)uVar30;
        uVar26 = uVar26 + 1;
      } while (lVar23 < lVar21);
      iVar24 = this->kPatternCount;
    }
    piVar4[lVar21] = iVar24;
    iVar24 = this->kPatternCount;
    if (0 < (long)iVar24) {
      pdVar5 = this->gPatternWeights;
      piVar6 = this->gPatternPartitions;
      lVar21 = 0;
      do {
        iVar19 = piVar17[lVar21];
        iVar25 = piVar4[piVar6[lVar21]];
        piVar17[lVar21] = (int)((long)iVar19 + (long)iVar25);
        pdVar1 = pdVar5 + lVar21;
        lVar21 = lVar21 + 1;
        pdVar18[(long)iVar19 + (long)iVar25] = *pdVar1;
      } while (iVar24 != lVar21);
    }
    iVar24 = this->kPartitionCount;
    if (0 < iVar24) {
      piVar17 = this->gPatternPartitions;
      lVar21 = 0;
      iVar19 = 0;
      do {
        iVar25 = *(int *)((long)__ptr + lVar21 * 4);
        if (0 < iVar25) {
          lVar23 = 0;
          do {
            piVar17[iVar19 + lVar23] = (int)lVar21;
            lVar23 = lVar23 + 1;
          } while (iVar25 != (int)lVar23);
          iVar19 = iVar19 + (int)lVar23;
          iVar24 = this->kPartitionCount;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < iVar24);
    }
    free(__ptr);
    free(this->gPatternWeights);
    this->gPatternWeights = pdVar18;
    local_38 = (float *)0x0;
    posix_memalign(&local_38,0x20,(long)this->kPartialsSize << 2);
    pfVar27 = local_38;
    local_38 = (float *)0x0;
    posix_memalign(&local_38,0x20,(long)this->kPaddedPatternCount << 2);
    iVar24 = this->kTipCount;
    __ptr_00 = local_38;
    if (0 < iVar24) {
      lVar21 = 0;
      pfVar29 = pfVar27;
      do {
        ppiVar7 = this->gTipStates;
        pfVar8 = (float *)ppiVar7[lVar21];
        if (pfVar8 == (float *)0x0) {
          ppfVar9 = this->gPartials;
          iVar19 = this->kCategoryCount;
          pfVar27 = ppfVar9[lVar21];
          if (0 < iVar19) {
            iVar28 = 0;
            iVar25 = 0;
            uVar2 = this->kPatternCount;
            uVar3 = this->kStateCount;
            do {
              if (0 < (int)uVar2) {
                uVar26 = 0;
                piVar17 = this->gPatternsNewOrder;
                iVar31 = iVar28;
                do {
                  if (0 < (int)uVar3) {
                    iVar20 = piVar17[uVar26] * uVar3 + iVar28;
                    uVar30 = (ulong)uVar3;
                    iVar16 = iVar31;
                    do {
                      lVar23 = (long)iVar16;
                      iVar16 = iVar16 + 1;
                      pfVar29[iVar20] = pfVar27[lVar23];
                      iVar20 = iVar20 + 1;
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                  }
                  uVar26 = uVar26 + 1;
                  iVar31 = iVar31 + uVar3;
                } while (uVar26 != uVar2);
              }
              iVar25 = iVar25 + 1;
              iVar28 = iVar28 + uVar2 * uVar3;
            } while (iVar25 != iVar19);
          }
          ppfVar9[lVar21] = pfVar29;
        }
        else {
          if (0 < this->kPatternCount) {
            piVar17 = this->gPatternsNewOrder;
            lVar23 = 0;
            do {
              piVar4 = piVar17 + lVar23;
              pfVar27 = pfVar8 + lVar23;
              lVar23 = lVar23 + 1;
              __ptr_00[*piVar4] = *pfVar27;
            } while (lVar23 < this->kPatternCount);
            iVar24 = this->kTipCount;
          }
          ppiVar7[lVar21] = (int *)__ptr_00;
          pfVar27 = pfVar29;
          __ptr_00 = pfVar8;
        }
        lVar21 = lVar21 + 1;
        pfVar29 = pfVar27;
      } while (lVar21 < iVar24);
    }
    free(pfVar27);
    free(__ptr_00);
    iVar24 = 0;
    this->kPatternsReordered = true;
  }
  return iVar24;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::reorderPatternsByPartition() {

    if (!kPatternsReordered) {
        gPatternsNewOrder = (int*) malloc(kPatternCount * sizeof(int));
    } else {
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    int* partitionSizes = (int*) malloc(kPartitionCount * sizeof(int));
    double* sortedPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);

    for (int i=0; i < kPartitionCount; i++) {
        gPatternPartitionsStartPatterns[i] = 0;
        partitionSizes[i] = 0;
    }

    for (int i=0; i < kPatternCount; i++) {
         gPatternsNewOrder[i] = partitionSizes[gPatternPartitions[i]]++;
    }

    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < i; j++) {
            gPatternPartitionsStartPatterns[i] += partitionSizes[j];
        }
    }
    gPatternPartitionsStartPatterns[kPartitionCount] = kPatternCount;

    for (int i=0; i < kPatternCount; i++) {
        gPatternsNewOrder[i] += gPatternPartitionsStartPatterns[gPatternPartitions[i]];
        sortedPatternWeights[gPatternsNewOrder[i]] = gPatternWeights[i];
    }


    int currentPattern = 0;
    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < partitionSizes[i]; j++) {
            gPatternPartitions[currentPattern++] = i;
        }
    }

    free(partitionSizes);
    free(gPatternWeights);
    gPatternWeights = sortedPatternWeights;

    REALTYPE* sortedPartials = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
    int* sortedTips = (int*) mallocAligned(sizeof(int) * kPaddedPatternCount);

    for (int tip=0; tip < kTipCount; tip++) {
        if (gTipStates[tip] == NULL) {
            REALTYPE* unsortedPartials = gPartials[tip];
            for (int l=0; l < kCategoryCount; l++) {
                for (int i=0; i < kPatternCount; i++) {
                    for (int j=0; j < kStateCount; j++) {
                        int sortIndex = l*kStateCount*kPatternCount + gPatternsNewOrder[i]*kStateCount + j;
                        int pIndex = l*kStateCount*kPatternCount + i*kStateCount + j;
                        sortedPartials[sortIndex] = unsortedPartials[pIndex];
                    }
                }
            }
            gPartials[tip] = sortedPartials;
            sortedPartials = unsortedPartials;
        } else {
            int* unsortedTips = gTipStates[tip];
            for (int i=0; i < kPatternCount; i++) {
                int sortIndex = gPatternsNewOrder[i];
                int pIndex = i;
                sortedTips[sortIndex] = unsortedTips[pIndex];
            }
            gTipStates[tip] = sortedTips;
            sortedTips = unsortedTips;
        }
    }

    free(sortedPartials);
    free(sortedTips);

    kPatternsReordered = true;

    return BEAGLE_SUCCESS;
}